

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O0

int __thiscall coda_url::create_scheme(coda_url *this,char *u,size_t sz,uint32_t flags)

{
  undefined4 *puVar1;
  int iVar2;
  char *pcVar3;
  size_t in_RDX;
  void *in_RSI;
  long *in_RDI;
  uint32_t unaff_retaddr;
  char *in_stack_00000008;
  undefined4 in_stack_00000010;
  int local_4;
  
  pcVar3 = coda_strxstr((char *)sz,(char *)CONCAT44(flags,in_stack_00000010),
                        (size_t)in_stack_00000008);
  iVar2 = (int)in_RDX;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = coda_strxstr((char *)sz,(char *)CONCAT44(flags,in_stack_00000010),
                          (size_t)in_stack_00000008);
    if (pcVar3 == (char *)0x0) {
      puVar1 = (undefined4 *)*in_RDI;
      *puVar1 = 0x70747468;
      *(undefined2 *)(puVar1 + 1) = 0x2f3a;
      *(undefined1 *)((long)puVar1 + 6) = 0x2f;
      *(undefined4 *)(in_RDI + 1) = 7;
      memcpy((void *)(*in_RDI + (ulong)*(uint *)(in_RDI + 1)),in_RSI,in_RDX);
      *(int *)(in_RDI + 1) = iVar2 + (int)in_RDI[1];
      local_4 = assign_anchor((coda_url *)CONCAT44(flags,in_stack_00000010),in_stack_00000008,
                              unaff_retaddr);
    }
    else {
      memcpy((void *)*in_RDI,in_RSI,in_RDX);
      *(int *)(in_RDI + 1) = (int)in_RDI[1] + iVar2;
      local_4 = assign_anchor((coda_url *)CONCAT44(flags,in_stack_00000010),in_stack_00000008,
                              unaff_retaddr);
    }
  }
  else {
    memcpy((void *)*in_RDI,in_RSI,in_RDX);
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + iVar2;
    local_4 = assign_anchor((coda_url *)CONCAT44(flags,in_stack_00000010),in_stack_00000008,
                            unaff_retaddr);
  }
  return local_4;
}

Assistant:

int coda_url::create_scheme(const char *u, size_t sz, uint32_t flags)
{
	if (coda_strxstr(u, "https://", 8))
	{
		val_len += coda_cpymsz(val_str, u, sz);
		return assign_anchor(val_str + 8, flags);
	}

	if (coda_strxstr(u, "http://", 7))
	{
		val_len += coda_cpymsz(val_str, u, sz);
		return assign_anchor(val_str + 7, flags);
	}

	val_len = coda_cpymsz(val_str, "http://", sizeof("http://") - 1);
	val_len = coda_cpymsz(val_str + val_len, u, sz) + val_len;
	return assign_anchor(val_str + 7, flags);
}